

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

OGet * __thiscall
MultiAgentDecisionProcessDiscrete::GetOGet(MultiAgentDecisionProcessDiscrete *this)

{
  ObservationModelMappingSparse *in_RDI;
  OGet_ObservationModelMappingSparse *in_stack_ffffffffffffffe0;
  OGet *local_8;
  
  if (((ulong)in_RDI[10].super_ObservationModelDiscrete.super_ObservationModelDiscreteInterface.
              super_ObservationModel._vptr_ObservationModel & 0x10000) == 0) {
    if (((ulong)in_RDI[10].super_ObservationModelDiscrete.super_ObservationModelDiscreteInterface.
                super_ObservationModel._vptr_ObservationModel & 0x100) == 0) {
      local_8 = (OGet *)operator_new(0x20);
      OGet_ObservationModelMapping::OGet_ObservationModelMapping
                ((OGet_ObservationModelMapping *)in_stack_ffffffffffffffe0,
                 (ObservationModelMapping *)in_RDI);
    }
    else {
      local_8 = (OGet *)operator_new(0x20);
      OGet_ObservationModelMappingSparse::OGet_ObservationModelMappingSparse
                (in_stack_ffffffffffffffe0,in_RDI);
    }
  }
  else if (((ulong)in_RDI[10].super_ObservationModelDiscrete.super_ObservationModelDiscreteInterface
                   .super_ObservationModel._vptr_ObservationModel & 0x100) == 0) {
    local_8 = (OGet *)operator_new(0x20);
    OGet_EventObservationModelMapping::OGet_EventObservationModelMapping
              ((OGet_EventObservationModelMapping *)in_stack_ffffffffffffffe0,
               (EventObservationModelMapping *)in_RDI);
  }
  else {
    local_8 = (OGet *)operator_new(0x20);
    OGet_EventObservationModelMappingSparse::OGet_EventObservationModelMappingSparse
              ((OGet_EventObservationModelMappingSparse *)in_stack_ffffffffffffffe0,
               (EventObservationModelMappingSparse *)in_RDI);
  }
  return local_8;
}

Assistant:

OGet* MultiAgentDecisionProcessDiscrete::GetOGet() const
{ 
    if(!_m_eventObservability) //default
    {
        if(_m_sparse)
            return new OGet_ObservationModelMappingSparse(
                    ((ObservationModelMappingSparse*)_m_p_oModel)  ); 
        else
            return new OGet_ObservationModelMapping(
                    ((ObservationModelMapping*)_m_p_oModel)  );
    }
    else
    {
        if(_m_sparse)
            return new OGet_EventObservationModelMappingSparse(
                    ((EventObservationModelMappingSparse*)_m_p_oModel)  ); 
        else
            return new OGet_EventObservationModelMapping(
                    ((EventObservationModelMapping*)_m_p_oModel)  );
    }    
}